

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

void __thiscall vkt::SpirVAssembly::ConvertCase::ConvertCase(ConvertCase *this,ConvertCase *param_1)

{
  IntegerType IVar1;
  
  this->m_features = param_1->m_features;
  IVar1 = param_1->m_toType;
  this->m_fromType = param_1->m_fromType;
  this->m_toType = IVar1;
  std::__cxx11::string::string((string *)&this->m_name,(string *)&param_1->m_name);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->m_asmTypes)._M_t._M_impl.super__Rb_tree_header);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&this->m_inputBuffer,&param_1->m_inputBuffer);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&this->m_outputBuffer,&param_1->m_outputBuffer);
  return;
}

Assistant:

ConvertCase (IntegerType from, IntegerType to, deInt64 number)
	: m_fromType		(from)
	, m_toType			(to)
	, m_features		(getConversionUsedFeatures(from, to))
	, m_name			(getTestName(from, to))
	, m_inputBuffer		(getBuffer(from, number))
	, m_outputBuffer	(getBuffer(to, number))
	{
		m_asmTypes["inputType"]		= getAsmTypeDeclaration(from);
		m_asmTypes["outputType"]	= getAsmTypeDeclaration(to);

		if (m_features == COMPUTE_TEST_USES_INT16)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int16\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT64)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int64\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT16_INT64)
		{
			m_asmTypes["int_capabilities"] = string("OpCapability Int16\n") +
													"OpCapability Int64\n";
		}
		else
		{
			DE_ASSERT(false);
		}
	}